

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::geometry::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat)

{
  undefined1 local_e0 [8];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentDescription colorAttachmentDescription;
  VkFormat colorFormat_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  colorAttachmentReference.attachment = 0;
  depthAttachmentReference.attachment = 0;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDescription.pPreserveAttachments = (deUint32 *)0xffffffff;
  renderPassInfo.pDependencies._0_4_ = 0;
  renderPassInfo.pDependencies._4_4_ = 0;
  subpassDescription.flags = 0;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments._0_4_ = 1;
  subpassDescription._24_8_ = &depthAttachmentReference;
  subpassDescription.pColorAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.pResolveAttachments =
       (VkAttachmentReference *)&subpassDescription.pPreserveAttachments;
  subpassDescription.pDepthStencilAttachment._0_4_ = 0;
  subpassDescription.preserveAttachmentCount = 0;
  subpassDescription._60_4_ = 0;
  local_e0._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassInfo._4_4_ = 0;
  renderPassInfo.pNext._0_4_ = 0;
  renderPassInfo.pNext._4_4_ = 1;
  renderPassInfo._16_8_ = &colorAttachmentReference;
  renderPassInfo.pAttachments._0_4_ = 1;
  renderPassInfo._32_8_ = &renderPassInfo.pDependencies;
  renderPassInfo.pSubpasses._0_4_ = 0;
  renderPassInfo.dependencyCount = 0;
  renderPassInfo._52_4_ = 0;
  colorAttachmentReference.layout = colorFormat;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,(VkRenderPassCreateInfo *)local_e0,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface& vk, const VkDevice device, const VkFormat colorFormat)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,				// VkAttachmentDescriptionFlags		flags;
		colorFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,							// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// VkAttachmentStoreOp				stencilStoreOp;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout					finalLayout;
	};

	const VkAttachmentReference colorAttachmentReference =
	{
		0u,												// deUint32			attachment;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL		// VkImageLayout	layout;
	};

	const VkAttachmentReference depthAttachmentReference =
	{
		VK_ATTACHMENT_UNUSED,							// deUint32			attachment;
		VK_IMAGE_LAYOUT_UNDEFINED						// VkImageLayout	layout;
	};

	const VkSubpassDescription subpassDescription =
	{
		(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
		0u,												// deUint32							inputAttachmentCount;
		DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
		1u,												// deUint32							colorAttachmentCount;
		&colorAttachmentReference,						// const VkAttachmentReference*		pColorAttachments;
		DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
		&depthAttachmentReference,						// const VkAttachmentReference*		pDepthStencilAttachment;
		0u,												// deUint32							preserveAttachmentCount;
		DE_NULL											// const deUint32*					pPreserveAttachments;
	};

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		(VkRenderPassCreateFlags)0,						// VkRenderPassCreateFlags			flags;
		1u,												// deUint32							attachmentCount;
		&colorAttachmentDescription,					// const VkAttachmentDescription*	pAttachments;
		1u,												// deUint32							subpassCount;
		&subpassDescription,							// const VkSubpassDescription*		pSubpasses;
		0u,												// deUint32							dependencyCount;
		DE_NULL											// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}